

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_create_art_index.cpp
# Opt level: O3

SinkResultType __thiscall
duckdb::PhysicalCreateARTIndex::Sink
          (PhysicalCreateARTIndex *this,ExecutionContext *context,DataChunk *chunk,
          OperatorSinkInput *input)

{
  DataChunk *this_00;
  LocalSinkState *pLVar1;
  idx_t count;
  pointer pcVar2;
  bool bVar3;
  reference pvVar4;
  ART *this_01;
  ConstraintException *this_02;
  pointer pCVar5;
  size_type __n;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pLVar1 = input->local_state;
  ArenaAllocator::Reset((ArenaAllocator *)&pLVar1[1].partition_info);
  this_00 = (DataChunk *)
            &pLVar1[2].partition_info.partition_data.
             super_vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>
             .
             super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  DataChunk::ReferenceColumns
            (this_00,chunk,(vector<unsigned_long,_true> *)&pLVar1[4].partition_info.partition_data);
  if (((this->alter_table_info).
       super_unique_ptr<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>_>._M_t.
       super___uniq_ptr_impl<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::AlterTableInfo_*,_std::default_delete<duckdb::AlterTableInfo>_>
       .super__Head_base<0UL,_duckdb::AlterTableInfo_*,_false>._M_head_impl != (AlterTableInfo *)0x0
      ) && (pLVar1[2].partition_info.partition_data.
            super_vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>.
            super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage !=
            pLVar1[2].partition_info.partition_data.
            super_vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>.
            super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>
            ._M_impl.super__Vector_impl_data._M_finish)) {
    count = pLVar1[3].partition_info.batch_index.index;
    __n = 0;
    do {
      pvVar4 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)this_00,__n)
      ;
      bVar3 = VectorOperations::HasNull(pvVar4,count);
      if (bVar3) {
        this_02 = (ConstraintException *)__cxa_allocate_exception(0x10);
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_70,"NOT NULL constraint failed: %s","");
        pCVar5 = unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>,_true>
                 ::operator->(&this->info);
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        pcVar2 = (pCVar5->index_name)._M_dataplus._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,pcVar2,pcVar2 + (pCVar5->index_name)._M_string_length);
        ConstraintException::ConstraintException<std::__cxx11::string>(this_02,&local_70,&local_50);
        __cxa_throw(this_02,&ConstraintException::typeinfo,::std::runtime_error::~runtime_error);
      }
      __n = __n + 1;
    } while (__n < (ulong)(((long)pLVar1[2].partition_info.partition_data.
                                  super_vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>
                                  .
                                  super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)pLVar1[2].partition_info.partition_data.
                                  super_vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>
                                  .
                                  super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>
                                  ._M_impl.super__Vector_impl_data._M_finish >> 3) *
                          0x4ec4ec4ec4ec4ec5));
  }
  this_01 = (ART *)unique_ptr<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>,_true>::
                   operator->((unique_ptr<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>,_true>
                               *)(pLVar1 + 1));
  pvVar4 = vector<duckdb::Vector,_true>::operator[]
                     (&chunk->data,
                      ((long)(chunk->data).
                             super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                             super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)(chunk->data).
                             super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                             super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5 - 1
                     );
  ART::GenerateKeyVectors
            (this_01,(ArenaAllocator *)&pLVar1[1].partition_info,this_00,pvVar4,
             (unsafe_vector<ARTKey> *)(pLVar1 + 4),
             (unsafe_vector<ARTKey> *)&pLVar1[6].partition_info.min_batch_index);
  if (this->sorted == true) {
    SinkSorted(this,input);
  }
  else {
    SinkUnsorted(this,input);
  }
  return NEED_MORE_INPUT;
}

Assistant:

SinkResultType PhysicalCreateARTIndex::Sink(ExecutionContext &context, DataChunk &chunk,
                                            OperatorSinkInput &input) const {
	D_ASSERT(chunk.ColumnCount() >= 2);
	auto &l_state = input.local_state.Cast<CreateARTIndexLocalSinkState>();
	l_state.arena_allocator.Reset();
	l_state.key_chunk.ReferenceColumns(chunk, l_state.key_column_ids);

	// Check for NULLs, if we are creating a PRIMARY KEY.
	// FIXME: Later, we want to ensure that we skip the NULL check for any non-PK alter.
	if (alter_table_info) {
		auto row_count = l_state.key_chunk.size();
		for (idx_t i = 0; i < l_state.key_chunk.ColumnCount(); i++) {
			if (VectorOperations::HasNull(l_state.key_chunk.data[i], row_count)) {
				throw ConstraintException("NOT NULL constraint failed: %s", info->index_name);
			}
		}
	}

	l_state.local_index->Cast<ART>().GenerateKeyVectors(
	    l_state.arena_allocator, l_state.key_chunk, chunk.data[chunk.ColumnCount() - 1], l_state.keys, l_state.row_ids);

	if (sorted) {
		return SinkSorted(input);
	}
	return SinkUnsorted(input);
}